

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O2

ByteData * __thiscall
cfd::core::Block::SerializeBlockHeader(ByteData *__return_storage_ptr__,Block *this)

{
  Serializer obj;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_58;
  Serializer local_40;
  
  Serializer::Serializer(&local_40);
  Serializer::AddDirectNumber(&local_40,(this->header_).version);
  BlockHash::GetData((ByteData *)&_Stack_58,&(this->header_).prev_block_hash);
  Serializer::AddDirectBytes(&local_40,(ByteData *)&_Stack_58);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_58);
  BlockHash::GetData((ByteData *)&_Stack_58,&(this->header_).merkle_root_hash);
  Serializer::AddDirectBytes(&local_40,(ByteData *)&_Stack_58);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_58);
  Serializer::AddDirectNumber(&local_40,(this->header_).time);
  Serializer::AddDirectNumber(&local_40,(this->header_).bits);
  Serializer::AddDirectNumber(&local_40,(this->header_).nonce);
  Serializer::Output(__return_storage_ptr__,&local_40);
  Serializer::~Serializer(&local_40);
  return __return_storage_ptr__;
}

Assistant:

ByteData Block::SerializeBlockHeader() const {
  Serializer obj;
  obj.AddDirectNumber(header_.version);
  obj.AddDirectBytes(header_.prev_block_hash.GetData());
  obj.AddDirectBytes(header_.merkle_root_hash.GetData());
  obj.AddDirectNumber(header_.time);
  obj.AddDirectNumber(header_.bits);
  obj.AddDirectNumber(header_.nonce);
  return obj.Output();
}